

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndColumns(void)

{
  int iVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumnsSet *pIVar3;
  ImGuiColumnData *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImU32 col;
  int n_1;
  long lVar7;
  ImGuiCol idx;
  long lVar8;
  ImGuiID id;
  int n;
  ulong uVar9;
  int column_index;
  uint uVar10;
  float fVar11;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  float fVar12;
  bool held;
  bool hovered;
  undefined1 local_a8 [16];
  ulong local_90;
  float local_84;
  ImGuiContext *g;
  ImVec2 local_78;
  ImVec2 local_70;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ImRect column_rect;
  
  g = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).ColumnsSet;
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar2->DrawList);
  fVar12 = (pIVar2->DC).CursorPos.y;
  uVar10 = -(uint)(fVar12 <= pIVar3->LineMaxY);
  local_68 = (float)(~uVar10 & (uint)fVar12 | (uint)pIVar3->LineMaxY & uVar10);
  pIVar3->LineMaxY = local_68;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0;
  (pIVar2->DC).CursorPos.y = local_68;
  uVar10 = pIVar3->Flags;
  if ((uVar10 & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->StartMaxPosX;
  }
  if (((uVar10 & 1) == 0) && (pIVar2->SkipItems == false)) {
    local_84 = pIVar3->StartPosY;
    fVar12 = local_84 + 1.0;
    local_90 = 0xffffffffffffffff;
    lVar8 = 0x24;
    for (uVar9 = 1; iVar1 = pIVar3->Count, (long)uVar9 < (long)iVar1; uVar9 = uVar9 + 1) {
      local_a8._0_4_ = (pIVar2->Pos).x;
      fVar11 = GetColumnOffset((int)uVar9);
      local_a8._0_4_ = fVar11 + (float)local_a8._0_4_;
      id = pIVar3->ID + (int)uVar9;
      column_rect.Min.x = (float)local_a8._0_4_ + -4.0;
      local_a8._4_4_ = extraout_XMM0_Db;
      local_a8._8_4_ = extraout_XMM0_Dc;
      local_a8._12_4_ = extraout_XMM0_Dd;
      column_rect.Max.x = (float)local_a8._0_4_ + 4.0;
      column_rect.Min.y = local_84;
      column_rect.Max.y = local_68;
      KeepAliveID(id);
      bVar6 = IsClippedEx(&column_rect,id,false);
      if (!bVar6) {
        hovered = false;
        held = false;
        if ((pIVar3->Flags & 2) == 0) {
          ButtonBehavior(&column_rect,id,&hovered,&held,0);
          if (hovered == false) {
            if ((held & 1U) != 0) {
              g->MouseCursor = 4;
              goto LAB_00123f7f;
            }
          }
          else {
            g->MouseCursor = 4;
            if ((held & 1U) != 0) {
LAB_00123f7f:
              if ((*(byte *)((long)&((pIVar3->Columns).Data)->OffsetNorm + lVar8) & 2) == 0) {
                local_90 = uVar9;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
        }
        idx = hovered + 0x1b;
        if ((held & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_78.x = (float)(int)(float)local_a8._0_4_;
        fVar11 = (pIVar2->ClipRect).Min.y;
        uVar10 = -(uint)(fVar11 <= fVar12);
        local_70.y = (float)(~uVar10 & (uint)fVar11 | uVar10 & (uint)fVar12);
        fVar11 = (pIVar2->ClipRect).Max.y;
        local_78.y = local_68;
        if (fVar11 <= local_68) {
          local_78.y = fVar11;
        }
        local_70.x = local_78.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_70,&local_78,col,1.0);
      }
      lVar8 = lVar8 + 0x1c;
    }
    column_index = (int)local_90;
    if (column_index != -1) {
      if (pIVar3->IsBeingResized == false) {
        lVar8 = 4;
        for (lVar7 = 0; lVar7 <= iVar1; lVar7 = lVar7 + 1) {
          pIVar4 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar4->OffsetNorm + lVar8) =
               *(undefined4 *)((long)pIVar4 + lVar8 + -4);
          lVar8 = lVar8 + 0x1c;
        }
      }
      pIVar3->IsBeingResized = true;
      pIVar5 = GImGui;
      local_a8 = ZEXT416((uint)((((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0)
                               - (GImGui->CurrentWindow->Pos).x));
      fVar11 = GetColumnOffset(column_index + -1);
      fVar12 = (pIVar5->Style).ColumnsMinSpacing;
      fVar11 = fVar11 + fVar12;
      uVar10 = -(uint)(fVar11 <= (float)local_a8._0_4_);
      fVar11 = (float)(~uVar10 & (uint)fVar11 | local_a8._0_4_ & uVar10);
      if ((pIVar3->Flags & 4) != 0) {
        local_a8._4_4_ = local_a8._4_4_ & extraout_XMM0_Db_00;
        local_a8._0_4_ = fVar11;
        local_a8._8_4_ = local_a8._8_4_ & extraout_XMM0_Dc_00;
        local_a8._12_4_ = local_a8._12_4_ & extraout_XMM0_Dd_00;
        local_68 = fVar12;
        fVar12 = GetColumnOffset(column_index + 1);
        fVar11 = (float)local_a8._0_4_;
        if (fVar12 - local_68 <= (float)local_a8._0_4_) {
          fVar11 = fVar12 - local_68;
        }
      }
      SetColumnOffset(column_index,fVar11);
    }
    bVar6 = column_index != -1;
  }
  else {
    bVar6 = false;
  }
  pIVar3->IsBeingResized = bVar6;
  (pIVar2->DC).ColumnsSet = (ImGuiColumnsSet *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumnsSet* columns = window->DC.ColumnsSet;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(columns->Flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->StartMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    bool is_being_resized = false;
    if (!(columns->Flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = columns->StartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hw = GetColumnsRectHalfWidth(); // Half-width for interaction
            const ImRect column_rect(ImVec2(x - column_hw, y1), ImVec2(x + column_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(columns->Flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(columns->Columns[n].Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column (we clip the Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.)
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, ImMax(y1 + 1.0f, window->ClipRect.Min.y)), ImVec2(xi, ImMin(y2, window->ClipRect.Max.y)), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->DC.ColumnsSet = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}